

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBufferTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBufferDataStoreQueryCase::iterate
          (TextureBufferDataStoreQueryCase *this)

{
  bool bVar1;
  bool bVar2;
  ContextType ctxType;
  ApiType requiredApiType;
  deBool dVar3;
  int iVar4;
  RenderContext *pRVar5;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  undefined4 extraout_var;
  TestLog *pTVar6;
  Enum<int,_2UL> EVar7;
  GetNameFunc local_4a0;
  int local_498;
  string local_490;
  allocator<char> local_469;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  GLenum local_3e4;
  GetNameFunc p_Stack_3e0;
  deUint32 err_3;
  int local_3d8;
  GetNameFunc local_3d0;
  int local_3c8;
  string local_3c0;
  allocator<char> local_399;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  GLenum local_314;
  GetNameFunc p_Stack_310;
  deUint32 err_2;
  int local_308;
  GetNameFunc local_300;
  int local_2f8;
  string local_2f0;
  allocator<char> local_2c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  GLenum local_248;
  GLuint local_244;
  deUint32 err_1;
  GLuint buffer;
  GLuint texture_1;
  allocator<char> local_211;
  string local_210;
  ScopedLogSection local_1f0;
  ScopedLogSection section_1;
  TestLog *local_1d8;
  int local_1d0;
  string local_1c8;
  allocator<char> local_1a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  GLenum local_11c;
  GLuint local_118;
  deUint32 err;
  GLuint texture;
  allocator<char> local_e9;
  string local_e8;
  ScopedLogSection local_c8;
  ScopedLogSection section;
  string local_b8;
  undefined1 local_98 [8];
  ResultCollector result;
  CallLogWrapper gl;
  bool supportsES32;
  TextureBufferDataStoreQueryCase *this_local;
  
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  while( true ) {
    dVar3 = ::deGetFalse();
    if (dVar3 != 0) break;
    if (!bVar1) {
      this_00 = Context::getContextInfo((this->super_TestCase).m_context);
      bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_texture_buffer");
      if (!bVar2) break;
    }
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
      iVar4 = (*pRVar5->_vptr_RenderContext[3])();
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      glu::CallLogWrapper::CallLogWrapper
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
                 (Functions *)CONCAT44(extraout_var,iVar4),pTVar6);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8," // ERROR: ",(allocator<char> *)((long)&section.m_log + 7));
      tcu::ResultCollector::ResultCollector((ResultCollector *)local_98,pTVar6,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&section.m_log + 7));
      glu::CallLogWrapper::enableLogging
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"NonBuffer",&local_e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&texture,"Non-buffer",(allocator<char> *)((long)&err + 3));
      tcu::ScopedLogSection::ScopedLogSection(&local_c8,pTVar6,&local_e8,(string *)&texture);
      std::__cxx11::string::~string((string *)&texture);
      std::allocator<char>::~allocator((allocator<char> *)((long)&err + 3));
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
      glu::CallLogWrapper::glGenTextures
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),1,&local_118);
      glu::CallLogWrapper::glBindTexture
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0xde1,local_118);
      glu::CallLogWrapper::glTexStorage2D
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0xde1,1,0x8058,0x20,0x20);
      do {
        local_11c = glu::CallLogWrapper::glGetError
                              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
        if (local_11c != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a0,"Got Error ",&local_1a1);
          EVar7 = glu::getErrorStr(local_11c);
          section_1.m_log = (TestLog *)EVar7.m_getName;
          local_1d0 = EVar7.m_value;
          local_1d8 = section_1.m_log;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1c8,&local_1d8);
          std::operator+(&local_180,&local_1a0,&local_1c8);
          std::operator+(&local_160,&local_180,": ");
          std::operator+(&local_140,&local_160,"gen texture");
          tcu::ResultCollector::fail((ResultCollector *)local_98,&local_140);
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::allocator<char>::~allocator(&local_1a1);
        }
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      gls::StateQueryUtil::verifyStateTextureLevelInteger
                ((ResultCollector *)local_98,(CallLogWrapper *)((long)&result.m_message.field_2 + 8)
                 ,0xde1,0,0x8c2d,0,this->m_type);
      glu::CallLogWrapper::glDeleteTextures
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),1,&local_118);
      tcu::ScopedLogSection::~ScopedLogSection(&local_c8);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"Buffer",&local_211);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&texture_1,"Texture buffer",(allocator<char> *)((long)&buffer + 3));
      tcu::ScopedLogSection::ScopedLogSection(&local_1f0,pTVar6,&local_210,(string *)&texture_1);
      std::__cxx11::string::~string((string *)&texture_1);
      std::allocator<char>::~allocator((allocator<char> *)((long)&buffer + 3));
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator(&local_211);
      glu::CallLogWrapper::glGenTextures
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),1,&err_1);
      glu::CallLogWrapper::glBindTexture
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x8c2a,err_1);
      do {
        local_248 = glu::CallLogWrapper::glGetError
                              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
        if (local_248 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2c8,"Got Error ",&local_2c9);
          EVar7 = glu::getErrorStr(local_248);
          p_Stack_310 = EVar7.m_getName;
          local_308 = EVar7.m_value;
          local_300 = p_Stack_310;
          local_2f8 = local_308;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2f0,&local_300);
          std::operator+(&local_2a8,&local_2c8,&local_2f0);
          std::operator+(&local_288,&local_2a8,": ");
          std::operator+(&local_268,&local_288,"bind texture");
          tcu::ResultCollector::fail((ResultCollector *)local_98,&local_268);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::~string((string *)&local_288);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::allocator<char>::~allocator(&local_2c9);
        }
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      glu::CallLogWrapper::glGenBuffers
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),1,&local_244);
      glu::CallLogWrapper::glBindBuffer
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x8c2a,local_244);
      glu::CallLogWrapper::glBufferData
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x8c2a,0x20,(void *)0x0,
                 0x88e4);
      do {
        local_314 = glu::CallLogWrapper::glGetError
                              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
        if (local_314 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_398,"Got Error ",&local_399);
          EVar7 = glu::getErrorStr(local_314);
          p_Stack_3e0 = EVar7.m_getName;
          local_3d8 = EVar7.m_value;
          local_3d0 = p_Stack_3e0;
          local_3c8 = local_3d8;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_3c0,&local_3d0);
          std::operator+(&local_378,&local_398,&local_3c0);
          std::operator+(&local_358,&local_378,": ");
          std::operator+(&local_338,&local_358,"bind buf");
          tcu::ResultCollector::fail((ResultCollector *)local_98,&local_338);
          std::__cxx11::string::~string((string *)&local_338);
          std::__cxx11::string::~string((string *)&local_358);
          std::__cxx11::string::~string((string *)&local_378);
          std::__cxx11::string::~string((string *)&local_3c0);
          std::__cxx11::string::~string((string *)&local_398);
          std::allocator<char>::~allocator(&local_399);
        }
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      glu::CallLogWrapper::glTexBuffer
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x8c2a,0x8236,local_244);
      do {
        local_3e4 = glu::CallLogWrapper::glGetError
                              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
        if (local_3e4 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_468,"Got Error ",&local_469);
          EVar7 = glu::getErrorStr(local_3e4);
          local_4a0 = EVar7.m_getName;
          local_498 = EVar7.m_value;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_490,&local_4a0);
          std::operator+(&local_448,&local_468,&local_490);
          std::operator+(&local_428,&local_448,": ");
          std::operator+(&local_408,&local_428,"tex buffer");
          tcu::ResultCollector::fail((ResultCollector *)local_98,&local_408);
          std::__cxx11::string::~string((string *)&local_408);
          std::__cxx11::string::~string((string *)&local_428);
          std::__cxx11::string::~string((string *)&local_448);
          std::__cxx11::string::~string((string *)&local_490);
          std::__cxx11::string::~string((string *)&local_468);
          std::allocator<char>::~allocator(&local_469);
        }
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      gls::StateQueryUtil::verifyStateTextureLevelInteger
                ((ResultCollector *)local_98,(CallLogWrapper *)((long)&result.m_message.field_2 + 8)
                 ,0x8c2a,0,0x8c2d,local_244,this->m_type);
      glu::CallLogWrapper::glDeleteTextures
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),1,&err_1);
      glu::CallLogWrapper::glDeleteBuffers
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),1,&local_244);
      tcu::ScopedLogSection::~ScopedLogSection(&local_1f0);
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_98,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::ResultCollector::~ResultCollector((ResultCollector *)local_98);
      glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
      return STOP;
    }
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"GL_EXT_texture_buffer is not supported",
             "supportsES32 || m_context.getContextInfo().isExtensionSupported(\"GL_EXT_texture_buffer\")"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureBufferTests.cpp"
             ,0x157);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

TextureBufferDataStoreQueryCase::IterateResult TextureBufferDataStoreQueryCase::iterate (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	TCU_CHECK_AND_THROW(NotSupportedError, supportsES32 || m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_buffer"), "GL_EXT_texture_buffer is not supported");

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	// non-buffer
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "NonBuffer", "Non-buffer");

		glw::GLuint	texture;

		gl.glGenTextures(1, &texture);
		gl.glBindTexture(GL_TEXTURE_2D, texture);
		gl.glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 32, 32);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "gen texture");

		verifyStateTextureLevelInteger(result, gl, GL_TEXTURE_2D, 0, GL_TEXTURE_BUFFER_DATA_STORE_BINDING, 0, m_type);

		gl.glDeleteTextures(1, &texture);
	}

	// buffer
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Buffer", "Texture buffer");

		glw::GLuint	texture;
		glw::GLuint	buffer;

		gl.glGenTextures(1, &texture);
		gl.glBindTexture(GL_TEXTURE_BUFFER, texture);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind texture");

		gl.glGenBuffers(1, &buffer);
		gl.glBindBuffer(GL_TEXTURE_BUFFER, buffer);
		gl.glBufferData(GL_TEXTURE_BUFFER, 32, DE_NULL, GL_STATIC_DRAW);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind buf");

		gl.glTexBuffer(GL_TEXTURE_BUFFER, GL_R32UI, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "tex buffer");

		verifyStateTextureLevelInteger(result, gl, GL_TEXTURE_BUFFER, 0, GL_TEXTURE_BUFFER_DATA_STORE_BINDING, buffer, m_type);

		gl.glDeleteTextures(1, &texture);
		gl.glDeleteBuffers(1, &buffer);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}